

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTDMT_bufferPool * ZSTDMT_expandBufferPool(ZSTDMT_bufferPool *srcBufPool,U32 nbWorkers)

{
  size_t sVar1;
  ZSTD_customMem cMem;
  
  if (srcBufPool == (ZSTDMT_bufferPool *)0x0) {
    srcBufPool = (ZSTDMT_bufferPool *)0x0;
  }
  else if (srcBufPool->totalBuffers < nbWorkers * 2 + 3) {
    cMem = srcBufPool->cMem;
    sVar1 = srcBufPool->bufferSize;
    ZSTDMT_freeBufferPool(srcBufPool);
    srcBufPool = ZSTDMT_createBufferPool(nbWorkers,cMem);
    if ((pthread_mutex_t *)srcBufPool != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)srcBufPool);
      ((pthread_mutex_t *)((long)srcBufPool + 0x28))->__align = sVar1;
      pthread_mutex_unlock((pthread_mutex_t *)srcBufPool);
    }
  }
  return (ZSTDMT_bufferPool *)(pthread_mutex_t *)srcBufPool;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_expandBufferPool(ZSTDMT_bufferPool* srcBufPool, U32 nbWorkers)
{
    unsigned const maxNbBuffers = 2*nbWorkers + 3;
    if (srcBufPool==NULL) return NULL;
    if (srcBufPool->totalBuffers >= maxNbBuffers) /* good enough */
        return srcBufPool;
    /* need a larger buffer pool */
    {   ZSTD_customMem const cMem = srcBufPool->cMem;
        size_t const bSize = srcBufPool->bufferSize;   /* forward parameters */
        ZSTDMT_bufferPool* newBufPool;
        ZSTDMT_freeBufferPool(srcBufPool);
        newBufPool = ZSTDMT_createBufferPool(nbWorkers, cMem);
        if (newBufPool==NULL) return newBufPool;
        ZSTDMT_setBufferSize(newBufPool, bSize);
        return newBufPool;
    }
}